

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# size.cpp
# Opt level: O2

int main(void)

{
  variant<int,_float,_double> ele;
  variant<int,_float,_double> ele_00;
  ostream *poVar1;
  heterovector hetvec;
  
  hetvec.vec.
  super__Vector_base<std::variant<int,_float,_double>,_std::allocator<std::variant<int,_float,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  hetvec.vec.
  super__Vector_base<std::variant<int,_float,_double>,_std::allocator<std::variant<int,_float,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  hetvec.vec.
  super__Vector_base<std::variant<int,_float,_double>,_std::allocator<std::variant<int,_float,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  heterovector::append(&hetvec,(variant<int,_float,_double>)ZEXT816(0));
  ele.super__Variant_base<int,_float,_double>.super__Move_assign_alias<int,_float,_double>.
  super__Copy_assign_alias<int,_float,_double>.super__Move_ctor_alias<int,_float,_double>.
  super__Copy_ctor_alias<int,_float,_double>.super__Variant_storage_alias<int,_float,_double>._8_8_
       = hetvec.vec.
         super__Vector_base<std::variant<int,_float,_double>,_std::allocator<std::variant<int,_float,_double>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  ele.super__Variant_base<int,_float,_double>.super__Move_assign_alias<int,_float,_double>.
  super__Copy_assign_alias<int,_float,_double>.super__Move_ctor_alias<int,_float,_double>.
  super__Copy_ctor_alias<int,_float,_double>.super__Variant_storage_alias<int,_float,_double>._M_u =
       (_Variadic_union<int,_float,_double>)
       hetvec.vec.
       super__Vector_base<std::variant<int,_float,_double>,_std::allocator<std::variant<int,_float,_double>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  heterovector::append(&hetvec,ele);
  ele_00.super__Variant_base<int,_float,_double>.super__Move_assign_alias<int,_float,_double>.
  super__Copy_assign_alias<int,_float,_double>.super__Move_ctor_alias<int,_float,_double>.
  super__Copy_ctor_alias<int,_float,_double>.super__Variant_storage_alias<int,_float,_double>._8_8_
       = hetvec.vec.
         super__Vector_base<std::variant<int,_float,_double>,_std::allocator<std::variant<int,_float,_double>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  ele_00.super__Variant_base<int,_float,_double>.super__Move_assign_alias<int,_float,_double>.
  super__Copy_assign_alias<int,_float,_double>.super__Move_ctor_alias<int,_float,_double>.
  super__Copy_ctor_alias<int,_float,_double>.super__Variant_storage_alias<int,_float,_double>._M_u =
       (_Variadic_union<int,_float,_double>)
       hetvec.vec.
       super__Vector_base<std::variant<int,_float,_double>,_std::allocator<std::variant<int,_float,_double>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  heterovector::append(&hetvec,ele_00);
  poVar1 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)&std::cout,
                      (int)((ulong)((long)hetvec.vec.
                                          super__Vector_base<std::variant<int,_float,_double>,_std::allocator<std::variant<int,_float,_double>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)hetvec.vec.
                                         super__Vector_base<std::variant<int,_float,_double>,_std::allocator<std::variant<int,_float,_double>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4));
  std::endl<char,std::char_traits<char>>(poVar1);
  std::
  _Vector_base<std::variant<int,_float,_double>,_std::allocator<std::variant<int,_float,_double>_>_>
  ::~_Vector_base((_Vector_base<std::variant<int,_float,_double>,_std::allocator<std::variant<int,_float,_double>_>_>
                   *)&hetvec);
  return 0;
}

Assistant:

int main() {
    heterovector hetvec;

    hetvec.append(3.1);
    hetvec.append(1);
    hetvec.append(0);

    std::cout << hetvec.size() << std::endl;

    return 0;
}